

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableHeadersRow(void)

{
  ImGuiTable *table;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *label;
  float row_min_height;
  ImVec2 IVar7;
  ImVec2 IVar8;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  
  table = GImGui->CurrentTable;
  if (table->IsLayoutLocked == false) {
    TableUpdateLayout(table);
  }
  IVar7 = GetCursorScreenPos();
  row_min_height = TableGetHeaderRowHeight();
  TableNextRow(1,row_min_height);
  if (table->HostSkipItems == false) {
    if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
      iVar6 = 0;
    }
    else {
      iVar6 = GImGui->CurrentTable->ColumnsCount;
      if (0 < iVar6) {
        iVar5 = 0;
        do {
          bVar3 = TableSetColumnIndex(iVar5);
          if (bVar3) {
            uVar4 = TableGetColumnFlags(iVar5);
            label = "";
            if ((uVar4 >> 0xc & 1) == 0) {
              label = TableGetColumnName(iVar5);
            }
            PushID((int)table->InstanceCurrent * table->ColumnsCount + iVar5);
            TableHeader(label);
            PopID();
          }
          iVar5 = iVar5 + 1;
        } while (iVar6 != iVar5);
      }
    }
    IVar8 = GetMousePos();
    bVar3 = IsMouseReleased(1);
    if (bVar3) {
      if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
        iVar5 = -1;
      }
      else {
        iVar5 = (int)GImGui->CurrentTable->HoveredColumnBody;
      }
      if (iVar5 == iVar6) {
        auVar1._8_8_ = extraout_XMM0_Qb;
        auVar1._0_4_ = IVar7.x;
        auVar1._4_4_ = IVar7.y;
        auVar1 = vmovshdup_avx(auVar1);
        auVar2._8_8_ = extraout_XMM0_Qb_00;
        auVar2._0_4_ = IVar8.x;
        auVar2._4_4_ = IVar8.y;
        auVar2 = vmovshdup_avx(auVar2);
        if ((auVar1._0_4_ <= auVar2._0_4_) && (auVar2._0_4_ < auVar1._0_4_ + row_min_height)) {
          TableOpenContextMenu(-1);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableHeadersRow()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeadersRow() after BeginTable()!");

    // Layout if not already done (this is automatically done by TableNextRow, we do it here solely to facilitate stepping in debugger as it is frequent to step in TableUpdateLayout)
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    // Open row
    const float row_y1 = GetCursorScreenPos().y;
    const float row_height = TableGetHeaderRowHeight();
    TableNextRow(ImGuiTableRowFlags_Headers, row_height);
    if (table->HostSkipItems) // Merely an optimization, you may skip in your own code.
        return;

    const int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
    {
        if (!TableSetColumnIndex(column_n))
            continue;

        // Push an id to allow unnamed labels (generally accidental, but let's behave nicely with them)
        // - in your own code you may omit the PushID/PopID all-together, provided you know they won't collide
        // - table->InstanceCurrent is only >0 when we use multiple BeginTable/EndTable calls with same identifier.
        const char* name = (TableGetColumnFlags(column_n) & ImGuiTableColumnFlags_NoHeaderLabel) ? "" : TableGetColumnName(column_n);
        PushID(table->InstanceCurrent * table->ColumnsCount + column_n);
        TableHeader(name);
        PopID();
    }

    // Allow opening popup from the right-most section after the last column.
    ImVec2 mouse_pos = ImGui::GetMousePos();
    if (IsMouseReleased(1) && TableGetHoveredColumn() == columns_count)
        if (mouse_pos.y >= row_y1 && mouse_pos.y < row_y1 + row_height)
            TableOpenContextMenu(-1); // Will open a non-column-specific popup.
}